

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

void pulse_stream_destroy(cubeb_stream_conflict *stm)

{
  pa_mainloop_api *ppVar1;
  pa_stream *ppVar2;
  
  stream_cork(stm,CORK);
  (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
  ppVar2 = stm->output_stream;
  if (ppVar2 != (pa_stream *)0x0) {
    if (stm->drain_timer != (pa_time_event *)0x0) {
      ppVar1 = (*cubeb_pa_threaded_mainloop_get_api)(stm->context->mainloop);
      (*ppVar1->time_free)(stm->drain_timer);
      ppVar2 = stm->output_stream;
    }
    (*cubeb_pa_stream_set_state_callback)(ppVar2,(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_write_callback)
              (stm->output_stream,(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)(stm->output_stream);
    (*cubeb_pa_stream_unref)(stm->output_stream);
  }
  if (stm->input_stream != (pa_stream *)0x0) {
    (*cubeb_pa_stream_set_state_callback)(stm->input_stream,(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_read_callback)(stm->input_stream,(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)(stm->input_stream);
    (*cubeb_pa_stream_unref)(stm->input_stream);
  }
  (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (g_cubeb_log_level != CUBEB_LOG_DISABLED)
     ) {
    (*g_cubeb_log_callback)
              ("%s:%d: Cubeb stream (%p) destroyed successfully.\n","cubeb_pulse.c",0x435,stm);
  }
  free(stm);
  return;
}

Assistant:

static void
pulse_stream_destroy(cubeb_stream * stm)
{
  stream_cork(stm, CORK);

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  if (stm->output_stream) {

    if (stm->drain_timer) {
      /* there's no pa_rttime_free, so use this instead. */
      WRAP(pa_threaded_mainloop_get_api)
      (stm->context->mainloop)->time_free(stm->drain_timer);
    }

    WRAP(pa_stream_set_state_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_set_write_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->output_stream);
    WRAP(pa_stream_unref)(stm->output_stream);
  }

  if (stm->input_stream) {
    WRAP(pa_stream_set_state_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_set_read_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->input_stream);
    WRAP(pa_stream_unref)(stm->input_stream);
  }
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  LOG("Cubeb stream (%p) destroyed successfully.", stm);
  free(stm);
}